

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VConstVectorArray_ManyVector(int nvec,sunrealtype c,N_Vector *Z)

{
  void *__ptr;
  undefined8 *in_RSI;
  int in_EDI;
  undefined8 in_XMM0_Qa;
  N_Vector *Zsub;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_30;
  long local_28;
  
  __ptr = malloc((long)in_EDI << 3);
  for (local_28 = 0; local_28 < **(long **)*in_RSI; local_28 = local_28 + 1) {
    for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
      *(undefined8 *)((long)__ptr + local_30 * 8) =
           *(undefined8 *)(*(long *)(*(long *)in_RSI[local_30] + 0x10) + local_28 * 8);
    }
    N_VConstVectorArray(in_XMM0_Qa,in_EDI,__ptr);
  }
  free(__ptr);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VConstVectorArray)(int nvec, sunrealtype c, N_Vector* Z)
{
  SUNFunctionBegin(Z[0]->sunctx);
  sunindextype i, j;
  N_Vector* Zsub;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* create array of N_Vector pointers for reuse within loop */
  Zsub = NULL;
  Zsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Zsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VConstVectorArray for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(Z[0]); i++)
  {
    /* for each subvector, create the array of subvectors of X, Y and Z */
    for (j = 0; j < nvec; j++) { Zsub[j] = MANYVECTOR_SUBVEC(Z[j], i); }

    /* now call N_VConstVectorArray for this array of subvectors */
    SUNCheckCall(N_VConstVectorArray(nvec, c, Zsub));
  }

  /* clean up and return */
  free(Zsub);
  return SUN_SUCCESS;
}